

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vac(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  DisasJumpType DVar5;
  
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_m5,FLD_C_d1);
  if (iVar1 == 4) {
    DVar5 = DISAS_NEXT;
    iVar1 = get_field1(s,FLD_O_v1,FLD_C_b1);
    iVar2 = get_field1(s,FLD_O_v2,FLD_C_d4);
    iVar3 = get_field1(s,FLD_O_v3,FLD_C_i3);
    iVar4 = get_field1(s,FLD_O_v4,FLD_C_b4);
    gen_gvec128_4_i64(tcg_ctx,gen_ac2_i64,(uint8_t)iVar1,(uint8_t)iVar2,(uint8_t)iVar3,
                      (uint8_t)iVar4);
  }
  else {
    gen_program_exception(s,6);
    DVar5 = DISAS_NORETURN;
  }
  return DVar5;
}

Assistant:

static DisasJumpType op_vac(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (get_field(s, m5) != ES_128) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    gen_gvec128_4_i64(tcg_ctx, gen_ac2_i64, get_field(s, v1),
                      get_field(s, v2), get_field(s, v3),
                      get_field(s, v4));
    return DISAS_NEXT;
}